

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

char * sqlite3VdbeExpandSql(Vdbe *p,char *zRawSql)

{
  sqlite3 *psVar1;
  int iVar2;
  char *pcVar3;
  char *in_RSI;
  long *in_RDI;
  int nOut_1;
  Mem utf8;
  u8 enc;
  int nOut;
  char *zStart;
  char zBase [100];
  StrAccum out;
  Mem *pVar;
  int i;
  int nToken;
  int n;
  int nextIndex;
  int idx;
  sqlite3 *db;
  uint in_stack_fffffffffffffee8;
  uint uVar4;
  uint in_stack_fffffffffffffeec;
  StrAccum *in_stack_fffffffffffffef0;
  Vdbe *in_stack_fffffffffffffef8;
  char *in_stack_ffffffffffffff00;
  _func_void_void_ptr *in_stack_ffffffffffffff10;
  sqlite3 *in_stack_ffffffffffffff18;
  char *in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff28;
  uint in_stack_ffffffffffffff2c;
  char local_c8 [104];
  sqlite3 *local_60 [2];
  uint *local_38;
  int local_2c;
  int local_28;
  int local_20;
  int local_1c;
  char *local_10;
  
  local_1c = 0;
  local_20 = 1;
  psVar1 = (sqlite3 *)*in_RDI;
  sqlite3StrAccumInit((StrAccum *)local_60,local_c8,100,psVar1->aLimit[0]);
  local_60[0] = psVar1;
  local_10 = in_RSI;
  if (psVar1->nVdbeExec < 2) {
    while (*local_10 != '\0') {
      iVar2 = findNextHostParameter(in_stack_ffffffffffffff00,(int *)in_stack_fffffffffffffef8);
      sqlite3StrAccumAppend
                (in_stack_fffffffffffffef0,
                 (char *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),0);
      if (local_28 == 0) break;
      if (local_10[iVar2] == '?') {
        if (local_28 < 2) {
          local_1c = local_20;
        }
        else {
          sqlite3GetInt32((char *)in_stack_ffffffffffffff18,(int *)in_stack_ffffffffffffff10);
        }
      }
      else {
        local_1c = sqlite3VdbeParameterIndex
                             (in_stack_fffffffffffffef8,(char *)in_stack_fffffffffffffef0,
                              in_stack_fffffffffffffeec);
      }
      local_10 = local_10 + iVar2 + local_28;
      local_20 = local_1c + 1;
      local_38 = (uint *)(in_RDI[0xd] + (long)(local_1c + -1) * 0x38);
      if ((local_38[2] & 1) == 0) {
        if ((local_38[2] & 4) == 0) {
          if ((local_38[2] & 8) == 0) {
            if ((local_38[2] & 2) == 0) {
              if ((local_38[2] & 0x4000) == 0) {
                sqlite3StrAccumAppend
                          (in_stack_fffffffffffffef0,
                           (char *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),0);
                in_stack_fffffffffffffeec = local_38[3];
                for (local_2c = 0; local_2c < (int)in_stack_fffffffffffffeec;
                    local_2c = local_2c + 1) {
                  sqlite3XPrintf((StrAccum *)local_60,0,"%02x",
                                 (ulong)*(byte *)(*(long *)(local_38 + 4) + (long)local_2c));
                }
                sqlite3StrAccumAppend
                          (in_stack_fffffffffffffef0,
                           (char *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),0);
              }
              else {
                sqlite3XPrintf((StrAccum *)local_60,0,"zeroblob(%d)",(ulong)*local_38);
              }
            }
            else {
              in_stack_ffffffffffffff28 = CONCAT13(psVar1->enc,(int3)in_stack_ffffffffffffff28);
              if (psVar1->enc != '\x01') {
                memset(&stack0xfffffffffffffef0,0,0x38);
                in_stack_ffffffffffffff18 = psVar1;
                sqlite3VdbeMemSetStr
                          ((Mem *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                           in_stack_ffffffffffffff20,(int)((ulong)psVar1 >> 0x20),
                           (u8)((ulong)psVar1 >> 0x18),in_stack_ffffffffffffff10);
                sqlite3VdbeChangeEncoding
                          ((Mem *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),0);
                local_38 = (uint *)&stack0xfffffffffffffef0;
              }
              in_stack_ffffffffffffff2c = local_38[3];
              sqlite3XPrintf((StrAccum *)local_60,0,"\'%.*q\'",(ulong)in_stack_ffffffffffffff2c,
                             *(undefined8 *)(local_38 + 4));
              if ((char)((uint)in_stack_ffffffffffffff28 >> 0x18) != '\x01') {
                sqlite3VdbeMemRelease((Mem *)0x14e315);
              }
            }
          }
          else {
            sqlite3XPrintf(*(StrAccum **)local_38,(u32)local_60,(char *)0x0,"%!.15g");
          }
        }
        else {
          sqlite3XPrintf((StrAccum *)local_60,0,"%lld",*(undefined8 *)local_38);
        }
      }
      else {
        sqlite3StrAccumAppend
                  (in_stack_fffffffffffffef0,
                   (char *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),0);
      }
    }
  }
  else {
    while (uVar4 = in_stack_fffffffffffffee8, *local_10 != '\0') {
      do {
        pcVar3 = local_10 + 1;
        in_stack_fffffffffffffee8 = uVar4 & 0xffffff;
        if (*local_10 != '\n') {
          in_stack_fffffffffffffee8 = CONCAT13(*pcVar3 != '\0',(int3)uVar4);
        }
        uVar4 = in_stack_fffffffffffffee8;
        local_10 = pcVar3;
      } while ((char)(in_stack_fffffffffffffee8 >> 0x18) != '\0');
      sqlite3StrAccumAppend
                (in_stack_fffffffffffffef0,
                 (char *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),0);
      sqlite3StrAccumAppend
                (in_stack_fffffffffffffef0,
                 (char *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),0);
    }
  }
  pcVar3 = sqlite3StrAccumFinish((StrAccum *)0x14e415);
  return pcVar3;
}

Assistant:

SQLITE_PRIVATE char *sqlite3VdbeExpandSql(
  Vdbe *p,                 /* The prepared statement being evaluated */
  const char *zRawSql      /* Raw text of the SQL statement */
){
  sqlite3 *db;             /* The database connection */
  int idx = 0;             /* Index of a host parameter */
  int nextIndex = 1;       /* Index of next ? host parameter */
  int n;                   /* Length of a token prefix */
  int nToken;              /* Length of the parameter token */
  int i;                   /* Loop counter */
  Mem *pVar;               /* Value of a host parameter */
  StrAccum out;            /* Accumulate the output here */
  char zBase[100];         /* Initial working space */

  db = p->db;
  sqlite3StrAccumInit(&out, zBase, sizeof(zBase), 
                      db->aLimit[SQLITE_LIMIT_LENGTH]);
  out.db = db;
  if( db->nVdbeExec>1 ){
    while( *zRawSql ){
      const char *zStart = zRawSql;
      while( *(zRawSql++)!='\n' && *zRawSql );
      sqlite3StrAccumAppend(&out, "-- ", 3);
      assert( (zRawSql - zStart) > 0 );
      sqlite3StrAccumAppend(&out, zStart, (int)(zRawSql-zStart));
    }
  }else{
    while( zRawSql[0] ){
      n = findNextHostParameter(zRawSql, &nToken);
      assert( n>0 );
      sqlite3StrAccumAppend(&out, zRawSql, n);
      zRawSql += n;
      assert( zRawSql[0] || nToken==0 );
      if( nToken==0 ) break;
      if( zRawSql[0]=='?' ){
        if( nToken>1 ){
          assert( sqlite3Isdigit(zRawSql[1]) );
          sqlite3GetInt32(&zRawSql[1], &idx);
        }else{
          idx = nextIndex;
        }
      }else{
        assert( zRawSql[0]==':' || zRawSql[0]=='$' || zRawSql[0]=='@' );
        testcase( zRawSql[0]==':' );
        testcase( zRawSql[0]=='$' );
        testcase( zRawSql[0]=='@' );
        idx = sqlite3VdbeParameterIndex(p, zRawSql, nToken);
        assert( idx>0 );
      }
      zRawSql += nToken;
      nextIndex = idx + 1;
      assert( idx>0 && idx<=p->nVar );
      pVar = &p->aVar[idx-1];
      if( pVar->flags & MEM_Null ){
        sqlite3StrAccumAppend(&out, "NULL", 4);
      }else if( pVar->flags & MEM_Int ){
        sqlite3XPrintf(&out, 0, "%lld", pVar->u.i);
      }else if( pVar->flags & MEM_Real ){
        sqlite3XPrintf(&out, 0, "%!.15g", pVar->u.r);
      }else if( pVar->flags & MEM_Str ){
        int nOut;  /* Number of bytes of the string text to include in output */
#ifndef SQLITE_OMIT_UTF16
        u8 enc = ENC(db);
        Mem utf8;
        if( enc!=SQLITE_UTF8 ){
          memset(&utf8, 0, sizeof(utf8));
          utf8.db = db;
          sqlite3VdbeMemSetStr(&utf8, pVar->z, pVar->n, enc, SQLITE_STATIC);
          sqlite3VdbeChangeEncoding(&utf8, SQLITE_UTF8);
          pVar = &utf8;
        }
#endif
        nOut = pVar->n;
#ifdef SQLITE_TRACE_SIZE_LIMIT
        if( nOut>SQLITE_TRACE_SIZE_LIMIT ){
          nOut = SQLITE_TRACE_SIZE_LIMIT;
          while( nOut<pVar->n && (pVar->z[nOut]&0xc0)==0x80 ){ nOut++; }
        }
#endif    
        sqlite3XPrintf(&out, 0, "'%.*q'", nOut, pVar->z);
#ifdef SQLITE_TRACE_SIZE_LIMIT
        if( nOut<pVar->n ){
          sqlite3XPrintf(&out, 0, "/*+%d bytes*/", pVar->n-nOut);
        }
#endif
#ifndef SQLITE_OMIT_UTF16
        if( enc!=SQLITE_UTF8 ) sqlite3VdbeMemRelease(&utf8);
#endif
      }else if( pVar->flags & MEM_Zero ){
        sqlite3XPrintf(&out, 0, "zeroblob(%d)", pVar->u.nZero);
      }else{
        int nOut;  /* Number of bytes of the blob to include in output */
        assert( pVar->flags & MEM_Blob );
        sqlite3StrAccumAppend(&out, "x'", 2);
        nOut = pVar->n;
#ifdef SQLITE_TRACE_SIZE_LIMIT
        if( nOut>SQLITE_TRACE_SIZE_LIMIT ) nOut = SQLITE_TRACE_SIZE_LIMIT;
#endif
        for(i=0; i<nOut; i++){
          sqlite3XPrintf(&out, 0, "%02x", pVar->z[i]&0xff);
        }
        sqlite3StrAccumAppend(&out, "'", 1);
#ifdef SQLITE_TRACE_SIZE_LIMIT
        if( nOut<pVar->n ){
          sqlite3XPrintf(&out, 0, "/*+%d bytes*/", pVar->n-nOut);
        }
#endif
      }
    }
  }
  return sqlite3StrAccumFinish(&out);
}